

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderBlitting.cpp
# Opt level: O3

IterateResult __thiscall glcts::GeometryShaderBlitting::iterate(GeometryShaderBlitting *this)

{
  ostringstream *this_00;
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  TestError *this_01;
  char *description;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar6;
  TestContext *this_02;
  long lVar7;
  ulong uVar8;
  uchar expected_result_data [64];
  uchar layer_source1 [64];
  uchar result_data [64];
  uchar layer_target [64];
  uchar layer_source4 [64];
  uchar layer_source3 [64];
  uchar layer_source2 [64];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
               ,0x4a);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
    (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting up vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,0x51);
    (**(code **)(lVar5 + 0x6f8))(1);
    (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_read);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error generating texture objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,0x57);
    (**(code **)(lVar5 + 0x6d0))(1);
    (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_read_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting up framebuffer objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,0x5d);
    (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_draw);
    lVar7 = 0;
    (**(code **)(lVar5 + 0x1320))(0x806f,0,0x8058,4,4,4,0,0x1908,0x1401,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting up texture objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,100);
    (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_read);
    (**(code **)(lVar5 + 0x1320))(0x806f,0,0x8058,4,4,4,0,0x1908,0x1401,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting up texture objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                    ,0x69);
    layer_source1[0] = '\0';
    layer_source1[1] = '\0';
    layer_source1[2] = '\0';
    layer_source1[3] = '\0';
    layer_source1[4] = '\0';
    layer_source1[5] = '\0';
    layer_source1[6] = '\0';
    layer_source1[7] = '\0';
    layer_source1[8] = '\0';
    layer_source1[9] = '\0';
    layer_source1[10] = '\0';
    layer_source1[0xb] = '\0';
    layer_source1[0xc] = '\0';
    layer_source1[0xd] = '\0';
    layer_source1[0xe] = '\0';
    layer_source1[0xf] = '\0';
    layer_source1[0x10] = '\0';
    layer_source1[0x11] = '\0';
    layer_source1[0x12] = '\0';
    layer_source1[0x13] = '\0';
    layer_source1[0x14] = '\0';
    layer_source1[0x15] = '\0';
    layer_source1[0x16] = '\0';
    layer_source1[0x17] = '\0';
    layer_source1[0x18] = '\0';
    layer_source1[0x19] = '\0';
    layer_source1[0x1a] = '\0';
    layer_source1[0x1b] = '\0';
    layer_source1[0x1c] = '\0';
    layer_source1[0x1d] = '\0';
    layer_source1[0x1e] = '\0';
    layer_source1[0x1f] = '\0';
    layer_source1[0x20] = '\0';
    layer_source1[0x21] = '\0';
    layer_source1[0x22] = '\0';
    layer_source1[0x23] = '\0';
    layer_source1[0x24] = '\0';
    layer_source1[0x25] = '\0';
    layer_source1[0x26] = '\0';
    layer_source1[0x27] = '\0';
    layer_source1[0x28] = '\0';
    layer_source1[0x29] = '\0';
    layer_source1[0x2a] = '\0';
    layer_source1[0x2b] = '\0';
    layer_source1[0x2c] = '\0';
    layer_source1[0x2d] = '\0';
    layer_source1[0x2e] = '\0';
    layer_source1[0x2f] = '\0';
    layer_source1[0x30] = '\0';
    layer_source1[0x31] = '\0';
    layer_source1[0x32] = '\0';
    layer_source1[0x33] = '\0';
    layer_source1[0x34] = '\0';
    layer_source1[0x35] = '\0';
    layer_source1[0x36] = '\0';
    layer_source1[0x37] = '\0';
    layer_source1[0x38] = '\0';
    layer_source1[0x39] = '\0';
    layer_source1[0x3a] = '\0';
    layer_source1[0x3b] = '\0';
    layer_source1[0x3c] = '\0';
    layer_source1[0x3d] = '\0';
    layer_source1[0x3e] = '\0';
    layer_source1[0x3f] = '\0';
    layer_source2[0] = '\0';
    layer_source2[1] = '\0';
    layer_source2[2] = '\0';
    layer_source2[3] = '\0';
    layer_source2[4] = '\0';
    layer_source2[5] = '\0';
    layer_source2[6] = '\0';
    layer_source2[7] = '\0';
    layer_source2[8] = '\0';
    layer_source2[9] = '\0';
    layer_source2[10] = '\0';
    layer_source2[0xb] = '\0';
    layer_source2[0xc] = '\0';
    layer_source2[0xd] = '\0';
    layer_source2[0xe] = '\0';
    layer_source2[0xf] = '\0';
    layer_source2[0x10] = '\0';
    layer_source2[0x11] = '\0';
    layer_source2[0x12] = '\0';
    layer_source2[0x13] = '\0';
    layer_source2[0x14] = '\0';
    layer_source2[0x15] = '\0';
    layer_source2[0x16] = '\0';
    layer_source2[0x17] = '\0';
    layer_source2[0x18] = '\0';
    layer_source2[0x19] = '\0';
    layer_source2[0x1a] = '\0';
    layer_source2[0x1b] = '\0';
    layer_source2[0x1c] = '\0';
    layer_source2[0x1d] = '\0';
    layer_source2[0x1e] = '\0';
    layer_source2[0x1f] = '\0';
    layer_source2[0x20] = '\0';
    layer_source2[0x21] = '\0';
    layer_source2[0x22] = '\0';
    layer_source2[0x23] = '\0';
    layer_source2[0x24] = '\0';
    layer_source2[0x25] = '\0';
    layer_source2[0x26] = '\0';
    layer_source2[0x27] = '\0';
    layer_source2[0x28] = '\0';
    layer_source2[0x29] = '\0';
    layer_source2[0x2a] = '\0';
    layer_source2[0x2b] = '\0';
    layer_source2[0x2c] = '\0';
    layer_source2[0x2d] = '\0';
    layer_source2[0x2e] = '\0';
    layer_source2[0x2f] = '\0';
    layer_source2[0x30] = '\0';
    layer_source2[0x31] = '\0';
    layer_source2[0x32] = '\0';
    layer_source2[0x33] = '\0';
    layer_source2[0x34] = '\0';
    layer_source2[0x35] = '\0';
    layer_source2[0x36] = '\0';
    layer_source2[0x37] = '\0';
    layer_source2[0x38] = '\0';
    layer_source2[0x39] = '\0';
    layer_source2[0x3a] = '\0';
    layer_source2[0x3b] = '\0';
    layer_source2[0x3c] = '\0';
    layer_source2[0x3d] = '\0';
    layer_source2[0x3e] = '\0';
    layer_source2[0x3f] = '\0';
    layer_source3[0] = '\0';
    layer_source3[1] = '\0';
    layer_source3[2] = '\0';
    layer_source3[3] = '\0';
    layer_source3[4] = '\0';
    layer_source3[5] = '\0';
    layer_source3[6] = '\0';
    layer_source3[7] = '\0';
    layer_source3[8] = '\0';
    layer_source3[9] = '\0';
    layer_source3[10] = '\0';
    layer_source3[0xb] = '\0';
    layer_source3[0xc] = '\0';
    layer_source3[0xd] = '\0';
    layer_source3[0xe] = '\0';
    layer_source3[0xf] = '\0';
    layer_source3[0x10] = '\0';
    layer_source3[0x11] = '\0';
    layer_source3[0x12] = '\0';
    layer_source3[0x13] = '\0';
    layer_source3[0x14] = '\0';
    layer_source3[0x15] = '\0';
    layer_source3[0x16] = '\0';
    layer_source3[0x17] = '\0';
    layer_source3[0x18] = '\0';
    layer_source3[0x19] = '\0';
    layer_source3[0x1a] = '\0';
    layer_source3[0x1b] = '\0';
    layer_source3[0x1c] = '\0';
    layer_source3[0x1d] = '\0';
    layer_source3[0x1e] = '\0';
    layer_source3[0x1f] = '\0';
    layer_source3[0x20] = '\0';
    layer_source3[0x21] = '\0';
    layer_source3[0x22] = '\0';
    layer_source3[0x23] = '\0';
    layer_source3[0x24] = '\0';
    layer_source3[0x25] = '\0';
    layer_source3[0x26] = '\0';
    layer_source3[0x27] = '\0';
    layer_source3[0x28] = '\0';
    layer_source3[0x29] = '\0';
    layer_source3[0x2a] = '\0';
    layer_source3[0x2b] = '\0';
    layer_source3[0x2c] = '\0';
    layer_source3[0x2d] = '\0';
    layer_source3[0x2e] = '\0';
    layer_source3[0x2f] = '\0';
    layer_source3[0x30] = '\0';
    layer_source3[0x31] = '\0';
    layer_source3[0x32] = '\0';
    layer_source3[0x33] = '\0';
    layer_source3[0x34] = '\0';
    layer_source3[0x35] = '\0';
    layer_source3[0x36] = '\0';
    layer_source3[0x37] = '\0';
    layer_source3[0x38] = '\0';
    layer_source3[0x39] = '\0';
    layer_source3[0x3a] = '\0';
    layer_source3[0x3b] = '\0';
    layer_source3[0x3c] = '\0';
    layer_source3[0x3d] = '\0';
    layer_source3[0x3e] = '\0';
    layer_source3[0x3f] = '\0';
    layer_source4[0] = '\0';
    layer_source4[1] = '\0';
    layer_source4[2] = '\0';
    layer_source4[3] = '\0';
    layer_source4[4] = '\0';
    layer_source4[5] = '\0';
    layer_source4[6] = '\0';
    layer_source4[7] = '\0';
    layer_source4[8] = '\0';
    layer_source4[9] = '\0';
    layer_source4[10] = '\0';
    layer_source4[0xb] = '\0';
    layer_source4[0xc] = '\0';
    layer_source4[0xd] = '\0';
    layer_source4[0xe] = '\0';
    layer_source4[0xf] = '\0';
    layer_source4[0x10] = '\0';
    layer_source4[0x11] = '\0';
    layer_source4[0x12] = '\0';
    layer_source4[0x13] = '\0';
    layer_source4[0x14] = '\0';
    layer_source4[0x15] = '\0';
    layer_source4[0x16] = '\0';
    layer_source4[0x17] = '\0';
    layer_source4[0x18] = '\0';
    layer_source4[0x19] = '\0';
    layer_source4[0x1a] = '\0';
    layer_source4[0x1b] = '\0';
    layer_source4[0x1c] = '\0';
    layer_source4[0x1d] = '\0';
    layer_source4[0x1e] = '\0';
    layer_source4[0x1f] = '\0';
    layer_source4[0x20] = '\0';
    layer_source4[0x21] = '\0';
    layer_source4[0x22] = '\0';
    layer_source4[0x23] = '\0';
    layer_source4[0x24] = '\0';
    layer_source4[0x25] = '\0';
    layer_source4[0x26] = '\0';
    layer_source4[0x27] = '\0';
    layer_source4[0x28] = '\0';
    layer_source4[0x29] = '\0';
    layer_source4[0x2a] = '\0';
    layer_source4[0x2b] = '\0';
    layer_source4[0x2c] = '\0';
    layer_source4[0x2d] = '\0';
    layer_source4[0x2e] = '\0';
    layer_source4[0x2f] = '\0';
    layer_source4[0x30] = '\0';
    layer_source4[0x31] = '\0';
    layer_source4[0x32] = '\0';
    layer_source4[0x33] = '\0';
    layer_source4[0x34] = '\0';
    layer_source4[0x35] = '\0';
    layer_source4[0x36] = '\0';
    layer_source4[0x37] = '\0';
    layer_source4[0x38] = '\0';
    layer_source4[0x39] = '\0';
    layer_source4[0x3a] = '\0';
    layer_source4[0x3b] = '\0';
    layer_source4[0x3c] = '\0';
    layer_source4[0x3d] = '\0';
    layer_source4[0x3e] = '\0';
    layer_source4[0x3f] = '\0';
    layer_target[0x30] = '\0';
    layer_target[0x31] = '\0';
    layer_target[0x32] = '\0';
    layer_target[0x33] = '\0';
    layer_target[0x34] = '\0';
    layer_target[0x35] = '\0';
    layer_target[0x36] = '\0';
    layer_target[0x37] = '\0';
    layer_target[0x38] = '\0';
    layer_target[0x39] = '\0';
    layer_target[0x3a] = '\0';
    layer_target[0x3b] = '\0';
    layer_target[0x3c] = '\0';
    layer_target[0x3d] = '\0';
    layer_target[0x3e] = '\0';
    layer_target[0x3f] = '\0';
    layer_target[0x20] = '\0';
    layer_target[0x21] = '\0';
    layer_target[0x22] = '\0';
    layer_target[0x23] = '\0';
    layer_target[0x24] = '\0';
    layer_target[0x25] = '\0';
    layer_target[0x26] = '\0';
    layer_target[0x27] = '\0';
    layer_target[0x28] = '\0';
    layer_target[0x29] = '\0';
    layer_target[0x2a] = '\0';
    layer_target[0x2b] = '\0';
    layer_target[0x2c] = '\0';
    layer_target[0x2d] = '\0';
    layer_target[0x2e] = '\0';
    layer_target[0x2f] = '\0';
    layer_target[0x10] = '\0';
    layer_target[0x11] = '\0';
    layer_target[0x12] = '\0';
    layer_target[0x13] = '\0';
    layer_target[0x14] = '\0';
    layer_target[0x15] = '\0';
    layer_target[0x16] = '\0';
    layer_target[0x17] = '\0';
    layer_target[0x18] = '\0';
    layer_target[0x19] = '\0';
    layer_target[0x1a] = '\0';
    layer_target[0x1b] = '\0';
    layer_target[0x1c] = '\0';
    layer_target[0x1d] = '\0';
    layer_target[0x1e] = '\0';
    layer_target[0x1f] = '\0';
    layer_target[0] = '\0';
    layer_target[1] = '\0';
    layer_target[2] = '\0';
    layer_target[3] = '\0';
    layer_target[4] = '\0';
    layer_target[5] = '\0';
    layer_target[6] = '\0';
    layer_target[7] = '\0';
    layer_target[8] = '\0';
    layer_target[9] = '\0';
    layer_target[10] = '\0';
    layer_target[0xb] = '\0';
    layer_target[0xc] = '\0';
    layer_target[0xd] = '\0';
    layer_target[0xe] = '\0';
    layer_target[0xf] = '\0';
    do {
      layer_source1[lVar7] = 0xff;
      layer_source2[lVar7 + 1] = 0xff;
      layer_source3[lVar7 + 2] = 0xff;
      layer_source4[lVar7 + 3] = 0xff;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,(ulong)this->m_fbo_draw_id,(ulong)this->m_fbo_read_id,(ulong)this->m_to_draw,
               (ulong)this->m_to_read);
    (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_read);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,0,4,4,1,0x1908,0x1401,layer_source1);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,1,4,4,1,0x1908,0x1401,layer_source2);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,2,4,4,1,0x1908,0x1401,layer_source3);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,3,4,4,1,0x1908,0x1401,layer_source4);
    (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to_draw);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,0,4,4,1,0x1908,0x1401,layer_target);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,1,4,4,1,0x1908,0x1401,layer_target);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,2,4,4,1,0x1908,0x1401,layer_target);
    (**(code **)(lVar5 + 0x13c0))(0x806f,0,0,0,3,4,4,1,0x1908,0x1401,layer_target);
    GVar4 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    this->m_draw_fbo_completeness = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x170))(0x8ca8);
    this->m_read_fbo_completeness = GVar4;
    if (this->m_draw_fbo_completeness == 0x8cd5) {
      if (GVar4 == 0x8cd5) {
        iVar2 = 0;
        (**(code **)(lVar5 + 0x140))(0,0,4,4,0,0,4,4,0x4000,0x2600);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"Error blitting",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                        ,0xaa);
        do {
          expected_result_data[0x30] = '\0';
          expected_result_data[0x31] = '\0';
          expected_result_data[0x32] = '\0';
          expected_result_data[0x33] = '\0';
          expected_result_data[0x34] = '\0';
          expected_result_data[0x35] = '\0';
          expected_result_data[0x36] = '\0';
          expected_result_data[0x37] = '\0';
          expected_result_data[0x38] = '\0';
          expected_result_data[0x39] = '\0';
          expected_result_data[0x3a] = '\0';
          expected_result_data[0x3b] = '\0';
          expected_result_data[0x3c] = '\0';
          expected_result_data[0x3d] = '\0';
          expected_result_data[0x3e] = '\0';
          expected_result_data[0x3f] = '\0';
          expected_result_data[0x20] = '\0';
          expected_result_data[0x21] = '\0';
          expected_result_data[0x22] = '\0';
          expected_result_data[0x23] = '\0';
          expected_result_data[0x24] = '\0';
          expected_result_data[0x25] = '\0';
          expected_result_data[0x26] = '\0';
          expected_result_data[0x27] = '\0';
          expected_result_data[0x28] = '\0';
          expected_result_data[0x29] = '\0';
          expected_result_data[0x2a] = '\0';
          expected_result_data[0x2b] = '\0';
          expected_result_data[0x2c] = '\0';
          expected_result_data[0x2d] = '\0';
          expected_result_data[0x2e] = '\0';
          expected_result_data[0x2f] = '\0';
          expected_result_data[0x10] = '\0';
          expected_result_data[0x11] = '\0';
          expected_result_data[0x12] = '\0';
          expected_result_data[0x13] = '\0';
          expected_result_data[0x14] = '\0';
          expected_result_data[0x15] = '\0';
          expected_result_data[0x16] = '\0';
          expected_result_data[0x17] = '\0';
          expected_result_data[0x18] = '\0';
          expected_result_data[0x19] = '\0';
          expected_result_data[0x1a] = '\0';
          expected_result_data[0x1b] = '\0';
          expected_result_data[0x1c] = '\0';
          expected_result_data[0x1d] = '\0';
          expected_result_data[0x1e] = '\0';
          expected_result_data[0x1f] = '\0';
          expected_result_data[0] = '\0';
          expected_result_data[1] = '\0';
          expected_result_data[2] = '\0';
          expected_result_data[3] = '\0';
          expected_result_data[4] = '\0';
          expected_result_data[5] = '\0';
          expected_result_data[6] = '\0';
          expected_result_data[7] = '\0';
          expected_result_data[8] = '\0';
          expected_result_data[9] = '\0';
          expected_result_data[10] = '\0';
          expected_result_data[0xb] = '\0';
          expected_result_data[0xc] = '\0';
          expected_result_data[0xd] = '\0';
          expected_result_data[0xe] = '\0';
          expected_result_data[0xf] = '\0';
          if (iVar2 == 0) {
            expected_result_data[0x30] = layer_source1[0x30];
            expected_result_data[0x31] = layer_source1[0x31];
            expected_result_data[0x32] = layer_source1[0x32];
            expected_result_data[0x33] = layer_source1[0x33];
            expected_result_data[0x34] = layer_source1[0x34];
            expected_result_data[0x35] = layer_source1[0x35];
            expected_result_data[0x36] = layer_source1[0x36];
            expected_result_data[0x37] = layer_source1[0x37];
            expected_result_data[0x38] = layer_source1[0x38];
            expected_result_data[0x39] = layer_source1[0x39];
            expected_result_data[0x3a] = layer_source1[0x3a];
            expected_result_data[0x3b] = layer_source1[0x3b];
            expected_result_data[0x3c] = layer_source1[0x3c];
            expected_result_data[0x3d] = layer_source1[0x3d];
            expected_result_data[0x3e] = layer_source1[0x3e];
            expected_result_data[0x3f] = layer_source1[0x3f];
            expected_result_data[0x20] = layer_source1[0x20];
            expected_result_data[0x21] = layer_source1[0x21];
            expected_result_data[0x22] = layer_source1[0x22];
            expected_result_data[0x23] = layer_source1[0x23];
            expected_result_data[0x24] = layer_source1[0x24];
            expected_result_data[0x25] = layer_source1[0x25];
            expected_result_data[0x26] = layer_source1[0x26];
            expected_result_data[0x27] = layer_source1[0x27];
            expected_result_data[0x28] = layer_source1[0x28];
            expected_result_data[0x29] = layer_source1[0x29];
            expected_result_data[0x2a] = layer_source1[0x2a];
            expected_result_data[0x2b] = layer_source1[0x2b];
            expected_result_data[0x2c] = layer_source1[0x2c];
            expected_result_data[0x2d] = layer_source1[0x2d];
            expected_result_data[0x2e] = layer_source1[0x2e];
            expected_result_data[0x2f] = layer_source1[0x2f];
            expected_result_data[0x10] = layer_source1[0x10];
            expected_result_data[0x11] = layer_source1[0x11];
            expected_result_data[0x12] = layer_source1[0x12];
            expected_result_data[0x13] = layer_source1[0x13];
            expected_result_data[0x14] = layer_source1[0x14];
            expected_result_data[0x15] = layer_source1[0x15];
            expected_result_data[0x16] = layer_source1[0x16];
            expected_result_data[0x17] = layer_source1[0x17];
            expected_result_data[0x18] = layer_source1[0x18];
            expected_result_data[0x19] = layer_source1[0x19];
            expected_result_data[0x1a] = layer_source1[0x1a];
            expected_result_data[0x1b] = layer_source1[0x1b];
            expected_result_data[0x1c] = layer_source1[0x1c];
            expected_result_data[0x1d] = layer_source1[0x1d];
            expected_result_data[0x1e] = layer_source1[0x1e];
            expected_result_data[0x1f] = layer_source1[0x1f];
            expected_result_data[0] = layer_source1[0];
            expected_result_data[1] = layer_source1[1];
            expected_result_data[2] = layer_source1[2];
            expected_result_data[3] = layer_source1[3];
            expected_result_data[4] = layer_source1[4];
            expected_result_data[5] = layer_source1[5];
            expected_result_data[6] = layer_source1[6];
            expected_result_data[7] = layer_source1[7];
            expected_result_data[8] = layer_source1[8];
            expected_result_data[9] = layer_source1[9];
            expected_result_data[10] = layer_source1[10];
            expected_result_data[0xb] = layer_source1[0xb];
            expected_result_data[0xc] = layer_source1[0xc];
            expected_result_data[0xd] = layer_source1[0xd];
            expected_result_data[0xe] = layer_source1[0xe];
            expected_result_data[0xf] = layer_source1[0xf];
          }
          (**(code **)(lVar5 + 0x78))(0x8ca8,this->m_fbo_draw_id);
          (**(code **)(lVar5 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_draw,0,iVar2);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"Error setting up FBOs setUpFramebuffersForReading",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                          ,0xba);
          (**(code **)(lVar5 + 0x1220))(0,0,4,4,0x1908,0x1401,result_data);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"Failed to read rendered pixel data",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                          ,0xbf);
          uVar8 = 0xfffffffffffffffc;
          do {
            uVar1 = *(uint *)(expected_result_data + uVar8 + 4);
            if (uVar1 != *(uint *)(result_data + uVar8 + 4)) {
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Rendered data [",0xf);
              std::ostream::operator<<(this_00,(uint)result_data[uVar8 + 4]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)result_data[uVar8 + 5]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)result_data[uVar8 + 6]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)result_data[uVar8 + 7]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"] is different from reference data [",0x24);
              std::ostream::operator<<(this_00,uVar1 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)expected_result_data[uVar8 + 5]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)expected_result_data[uVar8 + 6]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(uint)expected_result_data[uVar8 + 7]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] !",3);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00cefff2;
            }
            uVar8 = uVar8 + 4;
          } while (uVar8 < 0x3c);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 4);
        this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
        testResult = QP_TEST_RESULT_PASS;
LAB_00cefff2:
        tcu::TestContext::setTestResult(this_02,testResult,description);
        return STOP;
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,
                 "Read framebuffer is reported as incomplete, though expected it to be complete",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                 ,0xa3);
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,
                 "Draw framebuffer is reported as incomplete, though expected it to be complete",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                 ,0x9e);
    }
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderBlitting::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up vertex array object");

	/* Generate texture objects */
	gl.genTextures(1, &m_to_draw);
	gl.genTextures(1, &m_to_read);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture objects");

	/* Generate framebuffer objects */
	gl.genFramebuffers(1, &m_fbo_draw_id);
	gl.genFramebuffers(1, &m_fbo_read_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up framebuffer objects");

	/* Configure texture storage */
	gl.bindTexture(GL_TEXTURE_3D, m_to_draw);
	gl.texImage3D(GL_TEXTURE_3D, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH, 0 /* border */,
				  GL_RGBA, GL_UNSIGNED_BYTE, NULL);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up texture objects");

	gl.bindTexture(GL_TEXTURE_3D, m_to_read);
	gl.texImage3D(GL_TEXTURE_3D, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH, 0 /* border */,
				  GL_RGBA, GL_UNSIGNED_BYTE, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up texture objects");

	unsigned char layer_source1[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source2[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source3[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_source4[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char layer_target[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
	unsigned char result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];

	memset(layer_source1, 0, sizeof(layer_source1));
	memset(layer_source2, 0, sizeof(layer_source2));
	memset(layer_source3, 0, sizeof(layer_source3));
	memset(layer_source4, 0, sizeof(layer_source4));
	memset(layer_target, 0, sizeof(layer_target));

	for (unsigned int n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		layer_source1[n * TEXTURE_TEXEL_COMPONENTS + 0] = 255;
		layer_source2[n * TEXTURE_TEXEL_COMPONENTS + 1] = 255;
		layer_source3[n * TEXTURE_TEXEL_COMPONENTS + 2] = 255;
		layer_source4[n * TEXTURE_TEXEL_COMPONENTS + 3] = 255;
	} /* for (all pixels) */

	/* Set up draw FBO */
	setUpFramebuffersForRendering(m_fbo_draw_id, m_fbo_read_id, m_to_draw, m_to_read);

	/* Fill texture objects with data */
	gl.bindTexture(GL_TEXTURE_3D, m_to_read);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source1);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source2);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source3);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_source4);

	gl.bindTexture(GL_TEXTURE_3D, m_to_draw);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* layer */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, layer_target);

	/* Check FB completeness */
	m_draw_fbo_completeness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);
	m_read_fbo_completeness = gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	if (m_draw_fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		TCU_FAIL("Draw framebuffer is reported as incomplete, though expected it to be complete");
	}

	if (m_read_fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
	{
		TCU_FAIL("Read framebuffer is reported as incomplete, though expected it to be complete");
	}

	/* Blit! */
	gl.blitFramebuffer(0 /* srcX0 */, 0 /* srcY0 */, TEXTURE_WIDTH, TEXTURE_HEIGHT, 0 /* dstX0 */, 0 /* dstY0 */,
					   TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_COLOR_BUFFER_BIT, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error blitting");

	for (unsigned int n = 0; n < TEXTURE_DEPTH /* layers */; ++n)
	{
		unsigned char expected_result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS];
		memset(expected_result_data, 0, sizeof(expected_result_data));

		if (n == 0)
		{
			memcpy(expected_result_data, layer_source1, sizeof(expected_result_data));
		}

		/* Set up read FBO */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_draw_id);

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_draw, 0, n);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up FBOs setUpFramebuffersForReading");

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, result_data);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to read rendered pixel data");

		/* Compare the rendered data with reference data */
		for (unsigned int index = 0; index < TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_TEXEL_COMPONENTS;
			 index += TEXTURE_TEXEL_COMPONENTS)
		{
			if (memcmp(&expected_result_data[index], &result_data[index], TEXTURE_TEXEL_COMPONENTS) != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << (int)result_data[index + 0] << ", "
								   << (int)result_data[index + 1] << ", " << (int)result_data[index + 2] << ", "
								   << (int)result_data[index + 3] << "] is different from reference data ["
								   << (int)expected_result_data[index + 0] << ", "
								   << (int)expected_result_data[index + 1] << ", "
								   << (int)expected_result_data[index + 2] << ", "
								   << (int)expected_result_data[index + 3] << "] !" << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		} /* for (each index) */
	}	 /* for (all layers) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}